

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlReadMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  _xmlSAXHandler *__dest;
  xmlParserCtxtPtr ctxt_00;
  xmlSAXHandlerV1 *__src;
  htmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int size_local;
  char *buffer_local;
  
  xmlInitParser();
  ctxt_00 = xmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    htmlDefaultSAXHandlerInit();
    if (ctxt_00->sax != (_xmlSAXHandler *)0x0) {
      __dest = ctxt_00->sax;
      __src = __htmlDefaultSAXHandler();
      memcpy(__dest,__src,0xe0);
    }
    buffer_local = (char *)htmlDoRead(ctxt_00,URL,encoding,options,0);
  }
  return (htmlDocPtr)buffer_local;
}

Assistant:

htmlDocPtr
htmlReadMemory(const char *buffer, int size, const char *URL, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;

    xmlInitParser();
    ctxt = xmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL)
        return (NULL);
    htmlDefaultSAXHandlerInit();
    if (ctxt->sax != NULL)
        memcpy(ctxt->sax, &htmlDefaultSAXHandler, sizeof(xmlSAXHandlerV1));
    return (htmlDoRead(ctxt, URL, encoding, options, 0));
}